

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

istream * PyreNet::operator>>(istream *is,Perceptron *p)

{
  Perceptron *this;
  bool bVar1;
  reference pdVar2;
  double *w;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  Perceptron *pPStack_18;
  int weightSize;
  Perceptron *p_local;
  istream *is_local;
  
  pPStack_18 = p;
  p_local = (Perceptron *)is;
  std::istream::operator>>(is,&p->inputSize);
  std::istream::operator>>(p_local,(int *)((long)&__range1 + 4));
  std::vector<double,_std::allocator<double>_>::resize(&pPStack_18->weights,(long)__range1._4_4_);
  this = pPStack_18;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&pPStack_18->weights);
  w = (double *)std::vector<double,_std::allocator<double>_>::end(&this->weights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&w);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    std::istream::operator>>(p_local,pdVar2);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return (istream *)p_local;
}

Assistant:

std::istream& operator>>(std::istream& is, Perceptron &p) {
        is >> p.inputSize;
        int weightSize;
        is >> weightSize;
        p.weights.resize(weightSize);
        for (double& w : p.weights)
            is >> w;
        return is;
    }